

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O2

Token __thiscall slang::parsing::Lexer::lexApostrophe(Lexer *this)

{
  byte base_00;
  byte *pbVar1;
  bool bVar2;
  bool *args_1;
  logic_t *args;
  LiteralBase *args_00;
  ulong uVar3;
  Token TVar4;
  LiteralBase base;
  LiteralBase base_1;
  bool local_b;
  bool local_a;
  logic_t local_9;
  
  pbVar1 = (byte *)this->sourceBuffer;
  base_00 = *pbVar1;
  uVar3 = (ulong)(base_00 - 0x53);
  if (base_00 - 0x53 < 0x28) {
    if ((0x100000001U >> (uVar3 & 0x3f) & 1) != 0) {
      this->sourceBuffer = (char *)(pbVar1 + 1);
      bVar2 = literalBaseFromChar(pbVar1[1],&base);
      if (bVar2) {
        this->sourceBuffer = this->sourceBuffer + 1;
      }
      else {
        base = Decimal;
      }
      args_1 = &local_a;
      local_a = true;
      args_00 = &base;
      goto LAB_00551de4;
    }
    if ((0x2000000020U >> (uVar3 & 0x3f) & 1) != 0) {
      this->sourceBuffer = (char *)(pbVar1 + 1);
      args = (logic_t *)&logic_t::x;
LAB_00551d78:
      TVar4 = create<slang::logic_t_const&>(this,UnbasedUnsizedLiteral,args);
      return TVar4;
    }
    if ((0x8000000080U >> (uVar3 & 0x3f) & 1) != 0) {
      this->sourceBuffer = (char *)(pbVar1 + 1);
      args = (logic_t *)&logic_t::z;
      goto LAB_00551d78;
    }
  }
  if (base_00 - 0x30 < 2) {
    this->sourceBuffer = (char *)(pbVar1 + 1);
    local_9.value = base_00 - 0x30;
    TVar4 = create<slang::logic_t>(this,UnbasedUnsizedLiteral,&local_9);
    return TVar4;
  }
  bVar2 = literalBaseFromChar(base_00,&base_1);
  if (!bVar2) {
    TVar4 = create<>(this,Apostrophe);
    return TVar4;
  }
  this->sourceBuffer = this->sourceBuffer + 1;
  args_1 = &local_b;
  local_b = false;
  args_00 = &base_1;
LAB_00551de4:
  TVar4 = create<slang::LiteralBase&,bool>(this,IntegerBase,args_00,args_1);
  return TVar4;
}

Assistant:

Token Lexer::lexApostrophe() {
    char c = peek();
    switch (c) {
        case '0':
        case '1':
            advance();
            return create(TokenKind::UnbasedUnsizedLiteral, (logic_t)getDigitValue(c));
        case 'x':
        case 'X':
            advance();
            return create(TokenKind::UnbasedUnsizedLiteral, logic_t::x);
        case 'Z':
        case 'z':
            advance();
            return create(TokenKind::UnbasedUnsizedLiteral, logic_t::z);
        case 's':
        case 'S': {
            advance();
            LiteralBase base;
            if (!literalBaseFromChar(peek(), base))
                base = LiteralBase::Decimal;
            else
                advance();
            return create(TokenKind::IntegerBase, base, true);
        }
        default: {
            LiteralBase base;
            if (literalBaseFromChar(peek(), base)) {
                advance();
                return create(TokenKind::IntegerBase, base, false);
            }

            // otherwise just an apostrophe token
            return create(TokenKind::Apostrophe);
        }
    }
}